

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O0

Instr decode(u32 pc,u16 code)

{
  ushort uVar1;
  Instr IVar2;
  undefined8 local_910;
  anon_union_4_2_94730066_for_Instr_4 local_908;
  undefined8 local_900;
  anon_union_4_2_94730066_for_Instr_4 local_8f8;
  undefined8 local_8f0;
  anon_union_4_2_94730066_for_Instr_4 local_8e8;
  undefined8 local_8e0;
  anon_union_4_2_94730066_for_Instr_4 local_8d8;
  undefined8 local_8d0;
  anon_union_4_2_94730066_for_Instr_4 local_8c8;
  undefined8 local_8c0;
  anon_union_4_2_94730066_for_Instr_4 local_8b8;
  undefined8 local_8b0;
  anon_union_4_2_94730066_for_Instr_4 local_8a8;
  undefined8 local_8a0;
  anon_union_4_2_94730066_for_Instr_4 local_898;
  undefined8 local_890;
  anon_union_4_2_94730066_for_Instr_4 local_888;
  undefined8 local_880;
  anon_union_4_2_94730066_for_Instr_4 local_878;
  undefined8 local_870;
  anon_union_4_2_94730066_for_Instr_4 local_868;
  undefined8 local_860;
  anon_union_4_2_94730066_for_Instr_4 local_858;
  undefined8 local_850;
  anon_union_4_2_94730066_for_Instr_4 local_848;
  undefined8 local_840;
  anon_union_4_2_94730066_for_Instr_4 local_838;
  undefined8 local_830;
  anon_union_4_2_94730066_for_Instr_4 local_828;
  undefined8 local_820;
  anon_union_4_2_94730066_for_Instr_4 local_818;
  undefined8 local_810;
  anon_union_4_2_94730066_for_Instr_4 local_808;
  undefined8 local_800;
  anon_union_4_2_94730066_for_Instr_4 local_7f8;
  undefined8 local_7f0;
  anon_union_4_2_94730066_for_Instr_4 local_7e8;
  undefined8 local_7e0;
  anon_union_4_2_94730066_for_Instr_4 local_7d8;
  undefined8 local_7d0;
  anon_union_4_2_94730066_for_Instr_4 local_7c8;
  undefined8 local_7c0;
  anon_union_4_2_94730066_for_Instr_4 local_7b8;
  undefined8 local_7b0;
  anon_union_4_2_94730066_for_Instr_4 local_7a8;
  undefined8 local_7a0;
  anon_union_4_2_94730066_for_Instr_4 local_798;
  undefined8 local_790;
  anon_union_4_2_94730066_for_Instr_4 local_788;
  undefined8 local_780;
  anon_union_4_2_94730066_for_Instr_4 local_778;
  undefined8 local_770;
  anon_union_4_2_94730066_for_Instr_4 local_768;
  undefined8 local_760;
  anon_union_4_2_94730066_for_Instr_4 local_758;
  undefined8 local_750;
  anon_union_4_2_94730066_for_Instr_4 local_748;
  undefined8 local_740;
  anon_union_4_2_94730066_for_Instr_4 local_738;
  undefined8 local_730;
  anon_union_4_2_94730066_for_Instr_4 local_728;
  undefined8 local_720;
  anon_union_4_2_94730066_for_Instr_4 local_718;
  undefined8 local_710;
  anon_union_4_2_94730066_for_Instr_4 local_708;
  undefined8 local_700;
  anon_union_4_2_94730066_for_Instr_4 local_6f8;
  undefined8 local_6f0;
  anon_union_4_2_94730066_for_Instr_4 local_6e8;
  undefined8 local_6e0;
  anon_union_4_2_94730066_for_Instr_4 local_6d8;
  undefined8 local_6d0;
  anon_union_4_2_94730066_for_Instr_4 local_6c8;
  undefined8 local_6c0;
  anon_union_4_2_94730066_for_Instr_4 local_6b8;
  undefined8 local_6b0;
  anon_union_4_2_94730066_for_Instr_4 local_6a8;
  undefined8 local_6a0;
  anon_union_4_2_94730066_for_Instr_4 local_698;
  undefined8 local_690;
  anon_union_4_2_94730066_for_Instr_4 local_688;
  undefined8 local_680;
  anon_union_4_2_94730066_for_Instr_4 local_678;
  undefined8 local_670;
  anon_union_4_2_94730066_for_Instr_4 local_668;
  undefined8 local_660;
  anon_union_4_2_94730066_for_Instr_4 local_658;
  undefined8 local_650;
  anon_union_4_2_94730066_for_Instr_4 local_648;
  undefined8 local_640;
  anon_union_4_2_94730066_for_Instr_4 local_638;
  undefined8 local_630;
  anon_union_4_2_94730066_for_Instr_4 local_628;
  undefined8 local_620;
  anon_union_4_2_94730066_for_Instr_4 local_618;
  undefined8 local_610;
  anon_union_4_2_94730066_for_Instr_4 local_608;
  undefined8 local_390;
  anon_union_4_2_94730066_for_Instr_4 local_388;
  undefined8 local_380;
  anon_union_4_2_94730066_for_Instr_4 local_378;
  undefined8 local_370;
  anon_union_4_2_94730066_for_Instr_4 local_368;
  undefined8 local_360;
  anon_union_4_2_94730066_for_Instr_4 local_358;
  undefined8 local_350;
  anon_union_4_2_94730066_for_Instr_4 local_348;
  undefined8 local_340;
  anon_union_4_2_94730066_for_Instr_4 local_338;
  undefined8 local_330;
  anon_union_4_2_94730066_for_Instr_4 local_328;
  undefined8 local_320;
  anon_union_4_2_94730066_for_Instr_4 local_318;
  undefined8 local_310;
  anon_union_4_2_94730066_for_Instr_4 local_308;
  undefined8 local_300;
  anon_union_4_2_94730066_for_Instr_4 local_2f8;
  undefined8 local_2f0;
  anon_union_4_2_94730066_for_Instr_4 local_2e8;
  undefined8 local_2e0;
  anon_union_4_2_94730066_for_Instr_4 local_2d8;
  undefined8 local_2d0;
  anon_union_4_2_94730066_for_Instr_4 local_2c8;
  undefined8 local_2c0;
  anon_union_4_2_94730066_for_Instr_4 local_2b8;
  undefined8 local_2b0;
  anon_union_4_2_94730066_for_Instr_4 local_2a8;
  undefined8 local_2a0;
  anon_union_4_2_94730066_for_Instr_4 local_298;
  undefined8 local_290;
  anon_union_4_2_94730066_for_Instr_4 local_288;
  undefined8 local_280;
  anon_union_4_2_94730066_for_Instr_4 local_278;
  undefined8 local_270;
  anon_union_4_2_94730066_for_Instr_4 local_268;
  undefined8 local_260;
  anon_union_4_2_94730066_for_Instr_4 local_258;
  undefined8 local_250;
  anon_union_4_2_94730066_for_Instr_4 local_248;
  undefined8 local_240;
  anon_union_4_2_94730066_for_Instr_4 local_238;
  undefined8 local_230;
  anon_union_4_2_94730066_for_Instr_4 local_228;
  undefined8 local_220;
  anon_union_4_2_94730066_for_Instr_4 local_218;
  undefined8 local_210;
  anon_union_4_2_94730066_for_Instr_4 local_208;
  undefined8 local_200;
  anon_union_4_2_94730066_for_Instr_4 local_1f8;
  undefined8 local_1f0;
  anon_union_4_2_94730066_for_Instr_4 local_1e8;
  undefined8 local_1e0;
  anon_union_4_2_94730066_for_Instr_4 local_1d8;
  undefined8 local_1d0;
  anon_union_4_2_94730066_for_Instr_4 local_1c8;
  undefined8 local_1c0;
  anon_union_4_2_94730066_for_Instr_4 local_1b8;
  undefined8 local_1b0;
  anon_union_4_2_94730066_for_Instr_4 local_1a8;
  undefined8 local_1a0;
  anon_union_4_2_94730066_for_Instr_4 local_198;
  undefined8 local_190;
  anon_union_4_2_94730066_for_Instr_4 local_188;
  undefined8 local_180;
  anon_union_4_2_94730066_for_Instr_4 local_178;
  undefined8 local_170;
  anon_union_4_2_94730066_for_Instr_4 local_168;
  undefined8 local_160;
  anon_union_4_2_94730066_for_Instr_4 local_158;
  undefined8 local_150;
  anon_union_4_2_94730066_for_Instr_4 local_148;
  undefined8 local_140;
  anon_union_4_2_94730066_for_Instr_4 local_138;
  undefined8 local_130;
  anon_union_4_2_94730066_for_Instr_4 local_128;
  undefined8 local_120;
  anon_union_4_2_94730066_for_Instr_4 local_118;
  undefined8 local_110;
  anon_union_4_2_94730066_for_Instr_4 local_108;
  undefined8 local_100;
  anon_union_4_2_94730066_for_Instr_4 local_f8;
  undefined8 local_f0;
  anon_union_4_2_94730066_for_Instr_4 local_e8;
  undefined8 local_e0;
  anon_union_4_2_94730066_for_Instr_4 local_d8;
  undefined8 local_d0;
  anon_union_4_2_94730066_for_Instr_4 local_c8;
  undefined8 local_c0;
  anon_union_4_2_94730066_for_Instr_4 local_b8;
  undefined8 local_b0;
  anon_union_4_2_94730066_for_Instr_4 local_a8;
  undefined8 local_a0;
  anon_union_4_2_94730066_for_Instr_4 local_98;
  undefined8 local_90;
  anon_union_4_2_94730066_for_Instr_4 local_88;
  undefined8 local_80;
  anon_union_4_2_94730066_for_Instr_4 local_78;
  undefined8 local_70;
  anon_union_4_2_94730066_for_Instr_4 local_68;
  undefined8 local_60;
  anon_union_4_2_94730066_for_Instr_4 local_58;
  undefined8 local_50;
  anon_union_4_2_94730066_for_Instr_4 local_48;
  undefined8 local_40;
  anon_union_4_2_94730066_for_Instr_4 local_38;
  undefined8 local_30;
  anon_union_4_2_94730066_for_Instr_4 local_28;
  byte local_1a;
  undefined4 uStack_14;
  u16 code_local;
  u32 pc_local;
  anon_union_4_2_94730066_for_Instr_4 local_c;
  
  switch(code >> 0xc) {
  case 0:
    switch(code & 0xf) {
    case 2:
      if ((code & 0xf0) == 0) {
        IVar2 = format_n(code,STC_SR_RN);
        local_30 = IVar2._0_8_;
        _uStack_14 = local_30;
        local_28 = IVar2.field_4;
        local_c.d = local_28.d;
        break;
      }
      if ((code & 0xf0) == 0x10) {
        IVar2 = format_n(code,STC_GBR_RN);
        local_40 = IVar2._0_8_;
        _uStack_14 = local_40;
        local_38 = IVar2.field_4;
        local_c.d = local_38.d;
        break;
      }
      if ((code & 0xf0) == 0x20) {
        IVar2 = format_n(code,STC_VBR_RN);
        local_50 = IVar2._0_8_;
        _uStack_14 = local_50;
        local_48 = IVar2.field_4;
        local_c.d = local_48.d;
        break;
      }
    default:
switchD_0010579a_default:
      IVar2 = format_0(INVALID_OP);
      local_910 = IVar2._0_8_;
      _uStack_14 = local_910;
      local_908 = IVar2.field_4;
      local_c.d = local_908.d;
      break;
    case 3:
      if ((code & 0xf0) == 0) {
        IVar2 = format_m(code,BSRF_RM);
        local_60 = IVar2._0_8_;
        _uStack_14 = local_60;
        local_58 = IVar2.field_4;
        local_c.d = local_58.d;
        break;
      }
      if ((code & 0xf0) == 0x20) {
        IVar2 = format_m(code,BRAF_RM);
        local_70 = IVar2._0_8_;
        _uStack_14 = local_70;
        local_68 = IVar2.field_4;
        local_c.d = local_68.d;
        break;
      }
      goto switchD_0010579a_default;
    case 4:
      IVar2 = format_nm(code,MOVB_RM_A_R0_RN);
      local_80 = IVar2._0_8_;
      _uStack_14 = local_80;
      local_78 = IVar2.field_4;
      local_c.d = local_78.d;
      break;
    case 5:
      IVar2 = format_nm(code,MOVW_RM_A_R0_RN);
      local_90 = IVar2._0_8_;
      _uStack_14 = local_90;
      local_88 = IVar2.field_4;
      local_c.d = local_88.d;
      break;
    case 6:
      IVar2 = format_nm(code,MOVL_RM_A_R0_RN);
      local_a0 = IVar2._0_8_;
      _uStack_14 = local_a0;
      local_98 = IVar2.field_4;
      local_c.d = local_98.d;
      break;
    case 7:
      IVar2 = format_nm(code,MULL_RM_RN);
      local_b0 = IVar2._0_8_;
      _uStack_14 = local_b0;
      local_a8 = IVar2.field_4;
      local_c.d = local_a8.d;
      break;
    case 8:
      if (code == 8) {
        IVar2 = format_0(CLRT);
        local_c0 = IVar2._0_8_;
        _uStack_14 = local_c0;
        local_b8 = IVar2.field_4;
        local_c.d = local_b8.d;
        break;
      }
      if (code == 0x18) {
        IVar2 = format_0(SETT);
        local_d0 = IVar2._0_8_;
        _uStack_14 = local_d0;
        local_c8 = IVar2.field_4;
        local_c.d = local_c8.d;
        break;
      }
      if (code == 0x28) {
        IVar2 = format_0(CLRMAC);
        local_e0 = IVar2._0_8_;
        _uStack_14 = local_e0;
        local_d8 = IVar2.field_4;
        local_c.d = local_d8.d;
        break;
      }
      goto switchD_0010579a_default;
    case 9:
      if ((code & 0xf0) == 0) {
        IVar2 = format_0(NOP);
        local_f0 = IVar2._0_8_;
        _uStack_14 = local_f0;
        local_e8 = IVar2.field_4;
        local_c.d = local_e8.d;
        break;
      }
      if ((code & 0xf0) == 0x10) {
        IVar2 = format_0(DIV0U);
        local_100 = IVar2._0_8_;
        _uStack_14 = local_100;
        local_f8 = IVar2.field_4;
        local_c.d = local_f8.d;
        break;
      }
      if ((code & 0xf0) == 0x20) {
        IVar2 = format_n(code,MOVT_RN);
        local_110 = IVar2._0_8_;
        _uStack_14 = local_110;
        local_108 = IVar2.field_4;
        local_c.d = local_108.d;
        break;
      }
      goto switchD_0010579a_default;
    case 10:
      if ((code & 0xf0) == 0) {
        IVar2 = format_n(code,STS_MACH_RN);
        local_120 = IVar2._0_8_;
        _uStack_14 = local_120;
        local_118 = IVar2.field_4;
        local_c.d = local_118.d;
        break;
      }
      if ((code & 0xf0) == 0x10) {
        IVar2 = format_n(code,STS_MACL_RN);
        local_130 = IVar2._0_8_;
        _uStack_14 = local_130;
        local_128 = IVar2.field_4;
        local_c.d = local_128.d;
        break;
      }
      if ((code & 0xf0) == 0x20) {
        IVar2 = format_n(code,STS_PR_RN);
        local_140 = IVar2._0_8_;
        _uStack_14 = local_140;
        local_138 = IVar2.field_4;
        local_c.d = local_138.d;
        break;
      }
      goto switchD_0010579a_default;
    case 0xb:
      if ((code & 0xf0) == 0) {
        IVar2 = format_0(RTS);
        local_150 = IVar2._0_8_;
        _uStack_14 = local_150;
        local_148 = IVar2.field_4;
        local_c.d = local_148.d;
        break;
      }
      if ((code & 0xf0) == 0x10) {
        IVar2 = format_0(SLEEP);
        local_160 = IVar2._0_8_;
        _uStack_14 = local_160;
        local_158 = IVar2.field_4;
        local_c.d = local_158.d;
        break;
      }
      if ((code & 0xf0) == 0x20) {
        IVar2 = format_0(RTE);
        local_170 = IVar2._0_8_;
        _uStack_14 = local_170;
        local_168 = IVar2.field_4;
        local_c.d = local_168.d;
        break;
      }
      goto switchD_0010579a_default;
    case 0xc:
      IVar2 = format_nm(code,MOVB_A_R0_RM_RN);
      local_180 = IVar2._0_8_;
      _uStack_14 = local_180;
      local_178 = IVar2.field_4;
      local_c.d = local_178.d;
      break;
    case 0xd:
      IVar2 = format_nm(code,MOVW_A_R0_RM_RN);
      local_190 = IVar2._0_8_;
      _uStack_14 = local_190;
      local_188 = IVar2.field_4;
      local_c.d = local_188.d;
      break;
    case 0xe:
      IVar2 = format_nm(code,MOVL_A_R0_RM_RN);
      local_1a0 = IVar2._0_8_;
      _uStack_14 = local_1a0;
      local_198 = IVar2.field_4;
      local_c.d = local_198.d;
      break;
    case 0xf:
      IVar2 = format_nm(code,MACL_ARMP_ARNP);
      local_1b0 = IVar2._0_8_;
      _uStack_14 = local_1b0;
      local_1a8 = IVar2.field_4;
      local_c.d = local_1a8.d;
    }
    break;
  case 1:
    IVar2 = format_nmd(code,MOVL_RM_A_D_RN,4);
    local_1c0 = IVar2._0_8_;
    _uStack_14 = local_1c0;
    local_1b8 = IVar2.field_4;
    local_c.d = local_1b8.d;
    break;
  case 2:
    switch(code & 0xf) {
    case 0:
      IVar2 = format_nm(code,MOVB_RM_ARN);
      local_1d0 = IVar2._0_8_;
      _uStack_14 = local_1d0;
      local_1c8 = IVar2.field_4;
      local_c.d = local_1c8.d;
      break;
    case 1:
      IVar2 = format_nm(code,MOVW_RM_ARN);
      local_1e0 = IVar2._0_8_;
      _uStack_14 = local_1e0;
      local_1d8 = IVar2.field_4;
      local_c.d = local_1d8.d;
      break;
    case 2:
      IVar2 = format_nm(code,MOVL_RM_ARN);
      local_1f0 = IVar2._0_8_;
      _uStack_14 = local_1f0;
      local_1e8 = IVar2.field_4;
      local_c.d = local_1e8.d;
      break;
    default:
      goto switchD_0010579a_default;
    case 4:
      IVar2 = format_nm(code,MOVB_RM_AMRN);
      local_200 = IVar2._0_8_;
      _uStack_14 = local_200;
      local_1f8 = IVar2.field_4;
      local_c.d = local_1f8.d;
      break;
    case 5:
      IVar2 = format_nm(code,MOVW_RM_AMRN);
      local_210 = IVar2._0_8_;
      _uStack_14 = local_210;
      local_208 = IVar2.field_4;
      local_c.d = local_208.d;
      break;
    case 6:
      IVar2 = format_nm(code,MOVL_RM_AMRN);
      local_220 = IVar2._0_8_;
      _uStack_14 = local_220;
      local_218 = IVar2.field_4;
      local_c.d = local_218.d;
      break;
    case 7:
      IVar2 = format_nm(code,DIV0S_RM_RN);
      local_230 = IVar2._0_8_;
      _uStack_14 = local_230;
      local_228 = IVar2.field_4;
      local_c.d = local_228.d;
      break;
    case 8:
      IVar2 = format_nm(code,TST_RM_RN);
      local_240 = IVar2._0_8_;
      _uStack_14 = local_240;
      local_238 = IVar2.field_4;
      local_c.d = local_238.d;
      break;
    case 9:
      IVar2 = format_nm(code,AND_RM_RN);
      local_250 = IVar2._0_8_;
      _uStack_14 = local_250;
      local_248 = IVar2.field_4;
      local_c.d = local_248.d;
      break;
    case 10:
      IVar2 = format_nm(code,XOR_RM_RN);
      local_260 = IVar2._0_8_;
      _uStack_14 = local_260;
      local_258 = IVar2.field_4;
      local_c.d = local_258.d;
      break;
    case 0xb:
      IVar2 = format_nm(code,OR_RM_RN);
      local_270 = IVar2._0_8_;
      _uStack_14 = local_270;
      local_268 = IVar2.field_4;
      local_c.d = local_268.d;
      break;
    case 0xc:
      IVar2 = format_nm(code,CMPSTR_RM_RN);
      local_280 = IVar2._0_8_;
      _uStack_14 = local_280;
      local_278 = IVar2.field_4;
      local_c.d = local_278.d;
      break;
    case 0xd:
      IVar2 = format_nm(code,XTRCT_RM_RN);
      local_290 = IVar2._0_8_;
      _uStack_14 = local_290;
      local_288 = IVar2.field_4;
      local_c.d = local_288.d;
      break;
    case 0xe:
      IVar2 = format_nm(code,MULUW_RM_RN);
      local_2a0 = IVar2._0_8_;
      _uStack_14 = local_2a0;
      local_298 = IVar2.field_4;
      local_c.d = local_298.d;
      break;
    case 0xf:
      IVar2 = format_nm(code,MULSW_RM_RN);
      local_2b0 = IVar2._0_8_;
      _uStack_14 = local_2b0;
      local_2a8 = IVar2.field_4;
      local_c.d = local_2a8.d;
    }
    break;
  case 3:
    switch(code & 0xf) {
    case 0:
      IVar2 = format_nm(code,CMPEQ_RM_RN);
      local_2c0 = IVar2._0_8_;
      _uStack_14 = local_2c0;
      local_2b8 = IVar2.field_4;
      local_c.d = local_2b8.d;
      break;
    default:
      goto switchD_0010579a_default;
    case 2:
      IVar2 = format_nm(code,CMPHS_RM_RN);
      local_2d0 = IVar2._0_8_;
      _uStack_14 = local_2d0;
      local_2c8 = IVar2.field_4;
      local_c.d = local_2c8.d;
      break;
    case 3:
      IVar2 = format_nm(code,CMPGE_RM_RN);
      local_2e0 = IVar2._0_8_;
      _uStack_14 = local_2e0;
      local_2d8 = IVar2.field_4;
      local_c.d = local_2d8.d;
      break;
    case 4:
      IVar2 = format_nm(code,DIV1_RM_RN);
      local_2f0 = IVar2._0_8_;
      _uStack_14 = local_2f0;
      local_2e8 = IVar2.field_4;
      local_c.d = local_2e8.d;
      break;
    case 5:
      IVar2 = format_nm(code,DMULUL_RM_RN);
      local_300 = IVar2._0_8_;
      _uStack_14 = local_300;
      local_2f8 = IVar2.field_4;
      local_c.d = local_2f8.d;
      break;
    case 6:
      IVar2 = format_nm(code,CMPHI_RM_RN);
      local_310 = IVar2._0_8_;
      _uStack_14 = local_310;
      local_308 = IVar2.field_4;
      local_c.d = local_308.d;
      break;
    case 7:
      IVar2 = format_nm(code,CMPGT_RM_RN);
      local_320 = IVar2._0_8_;
      _uStack_14 = local_320;
      local_318 = IVar2.field_4;
      local_c.d = local_318.d;
      break;
    case 8:
      IVar2 = format_nm(code,SUB_RM_RN);
      local_330 = IVar2._0_8_;
      _uStack_14 = local_330;
      local_328 = IVar2.field_4;
      local_c.d = local_328.d;
      break;
    case 10:
      IVar2 = format_nm(code,SUBC_RM_RN);
      local_340 = IVar2._0_8_;
      _uStack_14 = local_340;
      local_338 = IVar2.field_4;
      local_c.d = local_338.d;
      break;
    case 0xb:
      IVar2 = format_nm(code,SUBV_RM_RN);
      local_350 = IVar2._0_8_;
      _uStack_14 = local_350;
      local_348 = IVar2.field_4;
      local_c.d = local_348.d;
      break;
    case 0xc:
      IVar2 = format_nm(code,ADD_RM_RN);
      local_360 = IVar2._0_8_;
      _uStack_14 = local_360;
      local_358 = IVar2.field_4;
      local_c.d = local_358.d;
      break;
    case 0xd:
      IVar2 = format_nm(code,DMULSL_RM_RN);
      local_370 = IVar2._0_8_;
      _uStack_14 = local_370;
      local_368 = IVar2.field_4;
      local_c.d = local_368.d;
      break;
    case 0xe:
      IVar2 = format_nm(code,ADDC_RM_RN);
      local_380 = IVar2._0_8_;
      _uStack_14 = local_380;
      local_378 = IVar2.field_4;
      local_c.d = local_378.d;
      break;
    case 0xf:
      IVar2 = format_nm(code,ADDV_RM_RN);
      local_390 = IVar2._0_8_;
      _uStack_14 = local_390;
      local_388 = IVar2.field_4;
      local_c.d = local_388.d;
    }
    break;
  case 4:
    local_1a = (byte)code;
    IVar2 = (Instr)(*(code *)(&DAT_0010a0d4 + *(int *)(&DAT_0010a0d4 + (ulong)local_1a * 4)))();
    return IVar2;
  case 5:
    IVar2 = format_nmd(code,MOVL_A_D_RM_RN,4);
    local_610 = IVar2._0_8_;
    _uStack_14 = local_610;
    local_608 = IVar2.field_4;
    local_c.d = local_608.d;
    break;
  case 6:
    switch(code & 0xf) {
    case 0:
      IVar2 = format_nm(code,MOVB_ARM_RN);
      local_620 = IVar2._0_8_;
      _uStack_14 = local_620;
      local_618 = IVar2.field_4;
      local_c.d = local_618.d;
      break;
    case 1:
      IVar2 = format_nm(code,MOVW_ARM_RN);
      local_630 = IVar2._0_8_;
      _uStack_14 = local_630;
      local_628 = IVar2.field_4;
      local_c.d = local_628.d;
      break;
    case 2:
      IVar2 = format_nm(code,MOVL_ARM_RN);
      local_640 = IVar2._0_8_;
      _uStack_14 = local_640;
      local_638 = IVar2.field_4;
      local_c.d = local_638.d;
      break;
    case 3:
      IVar2 = format_nm(code,MOV_RM_RN);
      local_650 = IVar2._0_8_;
      _uStack_14 = local_650;
      local_648 = IVar2.field_4;
      local_c.d = local_648.d;
      break;
    case 4:
      IVar2 = format_nm(code,MOVB_ARMP_RN);
      local_660 = IVar2._0_8_;
      _uStack_14 = local_660;
      local_658 = IVar2.field_4;
      local_c.d = local_658.d;
      break;
    case 5:
      IVar2 = format_nm(code,MOVW_ARMP_RN);
      local_670 = IVar2._0_8_;
      _uStack_14 = local_670;
      local_668 = IVar2.field_4;
      local_c.d = local_668.d;
      break;
    case 6:
      IVar2 = format_nm(code,MOVL_ARMP_RN);
      local_680 = IVar2._0_8_;
      _uStack_14 = local_680;
      local_678 = IVar2.field_4;
      local_c.d = local_678.d;
      break;
    case 7:
      IVar2 = format_nm(code,NOT_RM_RN);
      local_690 = IVar2._0_8_;
      _uStack_14 = local_690;
      local_688 = IVar2.field_4;
      local_c.d = local_688.d;
      break;
    case 8:
      IVar2 = format_nm(code,SWAPB_RM_RN);
      local_6a0 = IVar2._0_8_;
      _uStack_14 = local_6a0;
      local_698 = IVar2.field_4;
      local_c.d = local_698.d;
      break;
    case 9:
      IVar2 = format_nm(code,SWAPW_RM_RN);
      local_6b0 = IVar2._0_8_;
      _uStack_14 = local_6b0;
      local_6a8 = IVar2.field_4;
      local_c.d = local_6a8.d;
      break;
    case 10:
      IVar2 = format_nm(code,NEGC_RM_RN);
      local_6c0 = IVar2._0_8_;
      _uStack_14 = local_6c0;
      local_6b8 = IVar2.field_4;
      local_c.d = local_6b8.d;
      break;
    case 0xb:
      IVar2 = format_nm(code,NEG_RM_RN);
      local_6d0 = IVar2._0_8_;
      _uStack_14 = local_6d0;
      local_6c8 = IVar2.field_4;
      local_c.d = local_6c8.d;
      break;
    case 0xc:
      IVar2 = format_nm(code,EXTUB_RM_RN);
      local_6e0 = IVar2._0_8_;
      _uStack_14 = local_6e0;
      local_6d8 = IVar2.field_4;
      local_c.d = local_6d8.d;
      break;
    case 0xd:
      IVar2 = format_nm(code,EXTUW_RM_RN);
      local_6f0 = IVar2._0_8_;
      _uStack_14 = local_6f0;
      local_6e8 = IVar2.field_4;
      local_c.d = local_6e8.d;
      break;
    case 0xe:
      IVar2 = format_nm(code,EXTSB_RM_RN);
      local_700 = IVar2._0_8_;
      _uStack_14 = local_700;
      local_6f8 = IVar2.field_4;
      local_c.d = local_6f8.d;
      break;
    case 0xf:
      IVar2 = format_nm(code,EXTSW_RM_RN);
      local_710 = IVar2._0_8_;
      _uStack_14 = local_710;
      local_708 = IVar2.field_4;
      local_c.d = local_708.d;
      break;
    default:
      goto switchD_0010579a_default;
    }
    break;
  case 7:
    IVar2 = format_ni(code,ADD_I_RN);
    local_720 = IVar2._0_8_;
    _uStack_14 = local_720;
    local_718 = IVar2.field_4;
    local_c.d = local_718.d;
    break;
  case 8:
    uVar1 = code & 0xf00;
    if ((code & 0xf00) == 0) {
      IVar2 = format_nd4(code,MOVB_R0_A_D_RN,1);
      local_730 = IVar2._0_8_;
      _uStack_14 = local_730;
      local_728 = IVar2.field_4;
      local_c.d = local_728.d;
      break;
    }
    if (uVar1 == 0x100) {
      IVar2 = format_nd4(code,MOVW_R0_A_D_RN,2);
      local_740 = IVar2._0_8_;
      _uStack_14 = local_740;
      local_738 = IVar2.field_4;
      local_c.d = local_738.d;
      break;
    }
    if (uVar1 == 0x400) {
      IVar2 = format_md(code,MOVB_A_D_RM_R0,1);
      local_750 = IVar2._0_8_;
      _uStack_14 = local_750;
      local_748 = IVar2.field_4;
      local_c.d = local_748.d;
      break;
    }
    if (uVar1 == 0x500) {
      IVar2 = format_md(code,MOVW_A_D_RM_R0,2);
      local_760 = IVar2._0_8_;
      _uStack_14 = local_760;
      local_758 = IVar2.field_4;
      local_c.d = local_758.d;
      break;
    }
    if (uVar1 == 0x800) {
      IVar2 = format_si(code,CMPEQ_I_R0);
      local_770 = IVar2._0_8_;
      _uStack_14 = local_770;
      local_768 = IVar2.field_4;
      local_c.d = local_768.d;
      break;
    }
    if (uVar1 == 0x900) {
      IVar2 = format_sd(code,BT,pc);
      local_780 = IVar2._0_8_;
      _uStack_14 = local_780;
      local_778 = IVar2.field_4;
      local_c.d = local_778.d;
      break;
    }
    if (uVar1 == 0xb00) {
      IVar2 = format_sd(code,BF,pc);
      local_790 = IVar2._0_8_;
      _uStack_14 = local_790;
      local_788 = IVar2.field_4;
      local_c.d = local_788.d;
      break;
    }
    if (uVar1 == 0xd00) {
      IVar2 = format_sd(code,BTS,pc);
      local_7a0 = IVar2._0_8_;
      _uStack_14 = local_7a0;
      local_798 = IVar2.field_4;
      local_c.d = local_798.d;
      break;
    }
    if (uVar1 == 0xf00) {
      IVar2 = format_sd(code,BFS,pc);
      local_7b0 = IVar2._0_8_;
      _uStack_14 = local_7b0;
      local_7a8 = IVar2.field_4;
      local_c.d = local_7a8.d;
      break;
    }
    goto switchD_0010579a_default;
  case 9:
    IVar2 = format_nd8(code,MOVW_A_D_PC_RN,pc,2);
    local_7c0 = IVar2._0_8_;
    _uStack_14 = local_7c0;
    local_7b8 = IVar2.field_4;
    local_c.d = local_7b8.d;
    break;
  case 10:
    IVar2 = format_d12(code,BRA,pc);
    local_7d0 = IVar2._0_8_;
    _uStack_14 = local_7d0;
    local_7c8 = IVar2.field_4;
    local_c.d = local_7c8.d;
    break;
  case 0xb:
    IVar2 = format_d12(code,BSR,pc);
    local_7e0 = IVar2._0_8_;
    _uStack_14 = local_7e0;
    local_7d8 = IVar2.field_4;
    local_c.d = local_7d8.d;
    break;
  case 0xc:
    uVar1 = code & 0xf00;
    if ((code & 0xf00) == 0) {
      IVar2 = format_ud(code,MOVB_R0_A_D_GBR,1);
      local_7f0 = IVar2._0_8_;
      _uStack_14 = local_7f0;
      local_7e8 = IVar2.field_4;
      local_c.d = local_7e8.d;
      break;
    }
    if (uVar1 == 0x100) {
      IVar2 = format_ud(code,MOVW_R0_A_D_GBR,2);
      local_800 = IVar2._0_8_;
      _uStack_14 = local_800;
      local_7f8 = IVar2.field_4;
      local_c.d = local_7f8.d;
      break;
    }
    if (uVar1 == 0x200) {
      IVar2 = format_ud(code,MOVL_R0_A_D_GBR,4);
      local_810 = IVar2._0_8_;
      _uStack_14 = local_810;
      local_808 = IVar2.field_4;
      local_c.d = local_808.d;
      break;
    }
    if (uVar1 == 0x300) {
      IVar2 = format_i(code,TRAPA_I);
      local_820 = IVar2._0_8_;
      _uStack_14 = local_820;
      local_818 = IVar2.field_4;
      local_c.d = local_818.d;
      break;
    }
    if (uVar1 == 0x400) {
      IVar2 = format_ud(code,MOVB_A_D_GBR_R0,1);
      local_830 = IVar2._0_8_;
      _uStack_14 = local_830;
      local_828 = IVar2.field_4;
      local_c.d = local_828.d;
      break;
    }
    if (uVar1 == 0x500) {
      IVar2 = format_ud(code,MOVW_A_D_GBR_R0,2);
      local_840 = IVar2._0_8_;
      _uStack_14 = local_840;
      local_838 = IVar2.field_4;
      local_c.d = local_838.d;
      break;
    }
    if (uVar1 == 0x600) {
      IVar2 = format_ud(code,MOVL_A_D_GBR_R0,4);
      local_850 = IVar2._0_8_;
      _uStack_14 = local_850;
      local_848 = IVar2.field_4;
      local_c.d = local_848.d;
      break;
    }
    if (uVar1 == 0x700) {
      IVar2 = format_mova(code,MOVA_A_D_PC_R0,pc,4);
      local_860 = IVar2._0_8_;
      _uStack_14 = local_860;
      local_858 = IVar2.field_4;
      local_c.d = local_858.d;
      break;
    }
    if (uVar1 == 0x800) {
      IVar2 = format_i(code,TST_I_R0);
      local_870 = IVar2._0_8_;
      _uStack_14 = local_870;
      local_868 = IVar2.field_4;
      local_c.d = local_868.d;
      break;
    }
    if (uVar1 == 0x900) {
      IVar2 = format_i(code,AND_I_R0);
      local_880 = IVar2._0_8_;
      _uStack_14 = local_880;
      local_878 = IVar2.field_4;
      local_c.d = local_878.d;
      break;
    }
    if (uVar1 == 0xa00) {
      IVar2 = format_i(code,XOR_I_R0);
      local_890 = IVar2._0_8_;
      _uStack_14 = local_890;
      local_888 = IVar2.field_4;
      local_c.d = local_888.d;
      break;
    }
    if (uVar1 == 0xb00) {
      IVar2 = format_i(code,OR_I_R0);
      local_8a0 = IVar2._0_8_;
      _uStack_14 = local_8a0;
      local_898 = IVar2.field_4;
      local_c.d = local_898.d;
      break;
    }
    if (uVar1 == 0xc00) {
      IVar2 = format_i(code,TSTB_I_A_R0_GBR);
      local_8b0 = IVar2._0_8_;
      _uStack_14 = local_8b0;
      local_8a8 = IVar2.field_4;
      local_c.d = local_8a8.d;
      break;
    }
    if (uVar1 == 0xd00) {
      IVar2 = format_i(code,ANDB_I_A_R0_GBR);
      local_8c0 = IVar2._0_8_;
      _uStack_14 = local_8c0;
      local_8b8 = IVar2.field_4;
      local_c.d = local_8b8.d;
      break;
    }
    if (uVar1 == 0xe00) {
      IVar2 = format_i(code,XORB_I_A_R0_GBR);
      local_8d0 = IVar2._0_8_;
      _uStack_14 = local_8d0;
      local_8c8 = IVar2.field_4;
      local_c.d = local_8c8.d;
      break;
    }
    if (uVar1 == 0xf00) {
      IVar2 = format_i(code,ORB_I_A_R0_GBR);
      local_8e0 = IVar2._0_8_;
      _uStack_14 = local_8e0;
      local_8d8 = IVar2.field_4;
      local_c.d = local_8d8.d;
      break;
    }
    goto switchD_0010579a_default;
  case 0xd:
    IVar2 = format_nd8(code,MOVL_A_D_PC_RN,pc,4);
    local_8f0 = IVar2._0_8_;
    _uStack_14 = local_8f0;
    local_8e8 = IVar2.field_4;
    local_c.d = local_8e8.d;
    break;
  case 0xe:
    IVar2 = format_ni(code,MOV_I_RN);
    local_900 = IVar2._0_8_;
    _uStack_14 = local_900;
    local_8f8 = IVar2.field_4;
    local_c.d = local_8f8.d;
    break;
  case 0xf:
    goto switchD_0010579a_default;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]lupica/src/lupica.c",
                  0x3e1,"Instr decode(u32, u16)");
  }
  IVar2.field_4.d = local_c.d;
  IVar2.op = uStack_14;
  IVar2.n = (undefined1)pc_local;
  IVar2.m = pc_local._1_1_;
  IVar2.pad = pc_local._2_1_;
  IVar2._7_1_ = pc_local._3_1_;
  return IVar2;
}

Assistant:

Instr decode(u32 pc, u16 code) {
  switch (code >> 12) {
    case 0x0:
      // clang-format off
    switch (code & 0xf) {
      case 0x2:
        switch (code & 0xf0) {
          case 0x00: return format_n(code, STC_SR_RN);
          case 0x10: return format_n(code, STC_GBR_RN);
          case 0x20: return format_n(code, STC_VBR_RN);
        }
        break;
      case 0x3:
        switch (code & 0xf0) {
          case 0x00: return format_m(code, BSRF_RM);
          case 0x20: return format_m(code, BRAF_RM);
        }
        break;
      case 0x4: return format_nm(code, MOVB_RM_A_R0_RN);
      case 0x5: return format_nm(code, MOVW_RM_A_R0_RN);
      case 0x6: return format_nm(code, MOVL_RM_A_R0_RN);
      case 0x7: return format_nm(code, MULL_RM_RN);
      case 0x8:
        switch (code) {
          case 0x08: return format_0(CLRT);
          case 0x18: return format_0(SETT);
          case 0x28: return format_0(CLRMAC);
        }
        break;
      case 0x9:
        switch (code & 0xf0) {
          case 0x00: return format_0(NOP);
          case 0x10: return format_0(DIV0U);
          case 0x20: return format_n(code, MOVT_RN);
        }
        break;
      case 0xa:
        switch (code & 0xf0) {
          case 0x00: return format_n(code, STS_MACH_RN);
          case 0x10: return format_n(code, STS_MACL_RN);
          case 0x20: return format_n(code, STS_PR_RN);
        }
        break;
      case 0xb: // RTS SLEEP RTE
        switch (code & 0xf0) {
          case 0x00: return format_0(RTS);
          case 0x10: return format_0(SLEEP);
          case 0x20: return format_0(RTE);
        }
        break;
      case 0xc: return format_nm(code, MOVB_A_R0_RM_RN);
      case 0xd: return format_nm(code, MOVW_A_R0_RM_RN);
      case 0xe: return format_nm(code, MOVL_A_R0_RM_RN);
      case 0xf: return format_nm(code, MACL_ARMP_ARNP);
    }
      // clang-format on
      goto invalid;

    case 0x1:
      return format_nmd(code, MOVL_RM_A_D_RN, 4);

    case 0x2:
      // clang-format off
    switch (code & 0xf) {
      case 0x0: return format_nm(code, MOVB_RM_ARN);
      case 0x1: return format_nm(code, MOVW_RM_ARN);
      case 0x2: return format_nm(code, MOVL_RM_ARN);
      case 0x4: return format_nm(code, MOVB_RM_AMRN);
      case 0x5: return format_nm(code, MOVW_RM_AMRN);
      case 0x6: return format_nm(code, MOVL_RM_AMRN);
      case 0x7: return format_nm(code, DIV0S_RM_RN);
      case 0x8: return format_nm(code, TST_RM_RN);
      case 0x9: return format_nm(code, AND_RM_RN);
      case 0xa: return format_nm(code, XOR_RM_RN);
      case 0xb: return format_nm(code, OR_RM_RN);
      case 0xc: return format_nm(code, CMPSTR_RM_RN);
      case 0xd: return format_nm(code, XTRCT_RM_RN);
      case 0xe: return format_nm(code, MULUW_RM_RN);
      case 0xf: return format_nm(code, MULSW_RM_RN);
    }
      // clang-format on
      goto invalid;

    case 0x3:
      // clang-format off
    switch (code & 0xf) {
      case 0x0: return format_nm(code, CMPEQ_RM_RN);
      case 0x2: return format_nm(code, CMPHS_RM_RN);
      case 0x3: return format_nm(code, CMPGE_RM_RN);
      case 0x4: return format_nm(code, DIV1_RM_RN);
      case 0x5: return format_nm(code, DMULUL_RM_RN);
      case 0x6: return format_nm(code, CMPHI_RM_RN);
      case 0x7: return format_nm(code, CMPGT_RM_RN);
      case 0x8: return format_nm(code, SUB_RM_RN);
      case 0xa: return format_nm(code, SUBC_RM_RN);
      case 0xb: return format_nm(code, SUBV_RM_RN);
      case 0xc: return format_nm(code, ADD_RM_RN);
      case 0xd: return format_nm(code, DMULSL_RM_RN);
      case 0xe: return format_nm(code, ADDC_RM_RN);
      case 0xf: return format_nm(code, ADDV_RM_RN);
    }
      // clang-format on
      goto invalid;

    case 0x4:
      // clang-format off
    switch (code & 0xff) {
      case 0x00: return format_n(code, SHLL_RN);
      case 0x01: return format_n(code, SHLR_RN);
      case 0x02: return format_n(code, STSL_MACH_AMRN);
      case 0x03: return format_n(code, STCL_SR_AMRN);
      case 0x04: return format_n(code, ROTL_RN);
      case 0x05: return format_n(code, ROTR_RN);
      case 0x06: return format_m(code, LDSL_ARMP_MACH);
      case 0x07: return format_m(code, LDSL_ARMP_PR);
      case 0x08: return format_n(code, SHLL2_RN);
      case 0x09: return format_n(code, SHLR2_RN);
      case 0x0a: return format_m(code, LDS_RM_MACH);
      case 0x0b: return format_m(code, JSR_ARM);
      case 0x0e: return format_m(code, LDC_RM_SR);
      case 0x10: return format_n(code, DT_RN);
      case 0x11: return format_n(code, CMPPZ_RN);
      case 0x12: return format_n(code, STSL_MACL_AMRN);
      case 0x13: return format_n(code, STCL_GBR_AMRN);
      case 0x15: return format_n(code, CMPPL_RN);
      case 0x16: return format_m(code, LDSL_ARMP_MACL);
      case 0x17: return format_m(code, LDCL_ARMP_GBR);
      case 0x18: return format_n(code, SHLL8_RN);
      case 0x19: return format_n(code, SHLR8_RN);
      case 0x1a: return format_m(code, LDS_RM_MACL);
      case 0x1b: return format_n(code, TASB_ARN);
      case 0x1e: return format_m(code, LDC_RM_GBR);
      case 0x20: return format_n(code, SHAL_RN);
      case 0x21: return format_n(code, SHAR_RN);
      case 0x22: return format_n(code, STSL_PR_AMRN);
      case 0x23: return format_n(code, STCL_VBR_AMRN);
      case 0x24: return format_n(code, ROTCL_RN);
      case 0x25: return format_n(code, ROTCR_RN);
      case 0x26: return format_m(code, LDSL_ARMP_PR);
      case 0x27: return format_m(code, LDCL_ARMP_VBR);
      case 0x28: return format_n(code, SHLL16_RN);
      case 0x29: return format_n(code, SHLR16_RN);
      case 0x2a: return format_m(code, LDS_RM_PR);
      case 0x2b: return format_m(code, JMP_ARM);
      case 0x2e: return format_m(code, LDC_RM_VBR);

      case 0x0f: case 0x1f: case 0x2f: case 0x3f:
      case 0x4f: case 0x5f: case 0x6f: case 0x7f:
      case 0x8f: case 0x9f: case 0xaf: case 0xbf:
      case 0xcf: case 0xdf: case 0xef: case 0xff:
        return format_nm(code, MACW_ARMP_ARNP);
    }
      // clang-format on
      goto invalid;

    case 0x5:
      return format_nmd(code, MOVL_A_D_RM_RN, 4);

    case 0x6:
      // clang-format off
    switch (code & 0xf) {
      case 0x0: return format_nm(code, MOVB_ARM_RN);
      case 0x1: return format_nm(code, MOVW_ARM_RN);
      case 0x2: return format_nm(code, MOVL_ARM_RN);
      case 0x3: return format_nm(code, MOV_RM_RN);
      case 0x4: return format_nm(code, MOVB_ARMP_RN);
      case 0x5: return format_nm(code, MOVW_ARMP_RN);
      case 0x6: return format_nm(code, MOVL_ARMP_RN);
      case 0x7: return format_nm(code, NOT_RM_RN);
      case 0x8: return format_nm(code, SWAPB_RM_RN);
      case 0x9: return format_nm(code, SWAPW_RM_RN);
      case 0xa: return format_nm(code, NEGC_RM_RN);
      case 0xb: return format_nm(code, NEG_RM_RN);
      case 0xc: return format_nm(code, EXTUB_RM_RN);
      case 0xd: return format_nm(code, EXTUW_RM_RN);
      case 0xe: return format_nm(code, EXTSB_RM_RN);
      case 0xf: return format_nm(code, EXTSW_RM_RN);
    }
      // clang-format on
      goto invalid;

    case 0x7:
      return format_ni(code, ADD_I_RN);

    case 0x8:
      // clang-format off
    switch (code & 0x0f00) {
      case 0x000: return format_nd4(code, MOVB_R0_A_D_RN, 1);
      case 0x100: return format_nd4(code, MOVW_R0_A_D_RN, 2);
      case 0x400: return format_md(code, MOVB_A_D_RM_R0, 1);
      case 0x500: return format_md(code, MOVW_A_D_RM_R0, 2);
      case 0x800: return format_si(code, CMPEQ_I_R0);
      case 0x900: return format_sd(code, BT, pc);
      case 0xb00: return format_sd(code, BF, pc);
      case 0xd00: return format_sd(code, BTS, pc);
      case 0xf00: return format_sd(code, BFS, pc);
    }
      // clang-format on
      goto invalid;

    case 0x9:
      return format_nd8(code, MOVW_A_D_PC_RN, pc, 2);

    case 0xa:
      return format_d12(code, BRA, pc);

    case 0xb:
      return format_d12(code, BSR, pc);

    case 0xc:
      // clang-format off
    switch (code & 0x0f00) {
      case 0x0000: return format_ud(code, MOVB_R0_A_D_GBR, 1);
      case 0x0100: return format_ud(code, MOVW_R0_A_D_GBR, 2);
      case 0x0200: return format_ud(code, MOVL_R0_A_D_GBR, 4);
      case 0x0300: return format_i(code, TRAPA_I);
      case 0x0400: return format_ud(code, MOVB_A_D_GBR_R0, 1);
      case 0x0500: return format_ud(code, MOVW_A_D_GBR_R0, 2);
      case 0x0600: return format_ud(code, MOVL_A_D_GBR_R0, 4);
      case 0x0700: return format_mova(code, MOVA_A_D_PC_R0, pc, 4);
      case 0x0800: return format_i(code, TST_I_R0);
      case 0x0900: return format_i(code, AND_I_R0);
      case 0x0a00: return format_i(code, XOR_I_R0);
      case 0x0b00: return format_i(code, OR_I_R0);
      case 0x0c00: return format_i(code, TSTB_I_A_R0_GBR);
      case 0x0d00: return format_i(code, ANDB_I_A_R0_GBR);
      case 0x0e00: return format_i(code, XORB_I_A_R0_GBR);
      case 0x0f00: return format_i(code, ORB_I_A_R0_GBR);
    }
      // clang-format on
      goto invalid;

    case 0xd:
      return format_nd8(code, MOVL_A_D_PC_RN, pc, 4);

    case 0xe:
      return format_ni(code, MOV_I_RN);

    case 0xf: {
      goto invalid;
    }
  }

  assert(0);
invalid:
  return format_0(INVALID_OP);
}